

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeSetStabLimDet(void *cvode_mem,int sldet)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
  }
  else {
    if ((sldet == 0) || (*(int *)((long)cvode_mem + 0x20) == 2)) {
      *(int *)((long)cvode_mem + 0x498) = sldet;
      return 0;
    }
    msgfmt = "Attempt to use stability limit detection with the CV_ADAMS method illegal.";
    iVar1 = -0x16;
    error_code = -0x16;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVODE","CVodeSetStabLimDet",msgfmt);
  return iVar1;
}

Assistant:

int CVodeSetStabLimDet(void *cvode_mem, booleantype sldet)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetStabLimDet", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if( sldet && (cv_mem->cv_lmm != CV_BDF) ) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetStabLimDet", MSGCV_SET_SLDET);
    return(CV_ILL_INPUT);
  }

  cv_mem->cv_sldeton = sldet;

  return(CV_SUCCESS);
}